

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util.cpp
# Opt level: O0

int hexdigit_to_int(char ch)

{
  char ch_local;
  int local_4;
  
  switch(ch) {
  case '0':
    local_4 = 0;
    break;
  case '1':
    local_4 = 1;
    break;
  case '2':
    local_4 = 2;
    break;
  case '3':
    local_4 = 3;
    break;
  case '4':
    local_4 = 4;
    break;
  case '5':
    local_4 = 5;
    break;
  case '6':
    local_4 = 6;
    break;
  case '7':
    local_4 = 7;
    break;
  case '8':
    local_4 = 8;
    break;
  case '9':
    local_4 = 9;
    break;
  default:
    local_4 = -1;
    break;
  case 'A':
  case 'a':
    local_4 = 10;
    break;
  case 'B':
  case 'b':
    local_4 = 0xb;
    break;
  case 'C':
  case 'c':
    local_4 = 0xc;
    break;
  case 'D':
  case 'd':
    local_4 = 0xd;
    break;
  case 'E':
  case 'e':
    local_4 = 0xe;
    break;
  case 'F':
  case 'f':
    local_4 = 0xf;
  }
  return local_4;
}

Assistant:

int hexdigit_to_int(char ch)
{
	switch (ch)
	{
		case '0':
			return 0;
		case '1':
			return 1;
		case '2':
			return 2;
		case '3':
			return 3;
		case '4':
			return 4;
		case '5':
			return 5;
		case '6':
			return 6;
		case '7':
			return 7;
		case '8':
			return 8;
		case '9':
			return 9;
		case 'a':
		case 'A':
			return 10;
		case 'b':
		case 'B':
			return 11;
		case 'c':
		case 'C':
			return 12;
		case 'd':
		case 'D':
			return 13;
		case 'e':
		case 'E':
			return 14;
		case 'f':
		case 'F':
			return 15;
		default:
			return -1;
	}
}